

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O1

bool __thiscall
cmMacroHelperCommand::InvokeInitialPass
          (cmMacroHelperCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *inStatus)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMacroHelperCommand *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  byte bVar7;
  pointer pbVar8;
  long *plVar9;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  cmExecutionStatus *pcVar12;
  ulong uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  pointer pcVar15;
  pointer pcVar16;
  ulong uVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedArgs;
  cmExecutionStatus status;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  variables;
  cmListFileFunction newLFF;
  MacroPushPop macroScope;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argVs;
  string expandedArgv;
  string expandedArgn;
  string argcDef;
  ostringstream argcDefStream;
  char argvName [60];
  byte local_3c9;
  undefined1 local_3c8 [16];
  pointer local_3b8;
  string local_3a8;
  cmMacroHelperCommand *local_388;
  cmExecutionStatus *local_380;
  pointer local_378;
  cmListFileArgument local_370;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  undefined1 local_308 [32];
  _Alloc_hider local_2e8;
  size_type local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  pointer local_298;
  cmExecutionStatus *local_290;
  cmExecutionStatus *local_288;
  pointer local_280;
  MacroPushPop local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0 [3];
  ios_base local_180 [264];
  char local_78 [72];
  
  local_3c8 = (undefined1  [16])0x0;
  local_3b8 = (pointer)0x0;
  local_380 = inStatus;
  cmMakefile::ExpandArguments
            ((this->super_cmCommand).Makefile,args,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3c8,(char *)0x0);
  if ((ulong)((long)(local_3c8._8_8_ - local_3c8._0_8_) >> 5) <
      ((long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
    local_1f0[0]._M_dataplus._M_p = (pointer)&local_1f0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f0,"Macro invoked with incorrect arguments for macro named: ","");
    std::__cxx11::string::_M_append
              ((char *)local_1f0,
               (ulong)(((this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    cmCommand::SetError(&this->super_cmCommand,local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0[0]._M_dataplus._M_p != &local_1f0[0].field_2) {
      operator_delete(local_1f0[0]._M_dataplus._M_p,local_1f0[0].field_2._M_allocated_capacity + 1);
    }
    bVar7 = 0;
  }
  else {
    cmMakefile::MacroPushPop::MacroPushPop
              (&local_278,(this->super_cmCommand).Makefile,&this->FilePath,&this->Policies);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1f0);
    std::__cxx11::stringbuf::str();
    local_308._0_8_ =
         local_3c8._0_8_ +
         (long)(this->Args).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
         (-0x20 - (long)(this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    local_308._8_8_ = local_3c8._8_8_;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_230,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_308,";");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_250,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3c8,";");
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_328,
              ((long)(this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) - 1);
    pbVar8 = (this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_388 = this;
    if (0x20 < (ulong)((long)(this->Args).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8)) {
      uVar13 = 1;
      uVar17 = 2;
      do {
        std::operator+(&local_370.Value,"${",pbVar8 + uVar13);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_370);
        local_308._0_8_ = local_308 + 0x10;
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar9 + 2);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar9 == pbVar11)
        {
          local_308._16_8_ = (pbVar11->_M_dataplus)._M_p;
          local_308._24_8_ = plVar9[3];
        }
        else {
          local_308._16_8_ = (pbVar11->_M_dataplus)._M_p;
          local_308._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar9;
        }
        local_308._8_8_ = plVar9[1];
        *plVar9 = (long)pbVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_328,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_308 + 0x10))
        {
          operator_delete((void *)local_308._0_8_,(ulong)(local_308._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.Value._M_dataplus._M_p != &local_370.Value.field_2) {
          operator_delete(local_370.Value._M_dataplus._M_p,
                          CONCAT71(local_370.Value.field_2._M_allocated_capacity._1_7_,
                                   local_370.Value.field_2._M_local_buf[0]) + 1);
        }
        pbVar8 = (local_388->Args).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar6 = uVar17 < (ulong)((long)(local_388->Args).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >>
                                5);
        uVar13 = uVar17;
        uVar17 = (ulong)((int)uVar17 + 1);
      } while (bVar6);
    }
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_268,(long)(local_3c8._8_8_ - local_3c8._0_8_) >> 5);
    pcVar3 = local_388;
    if (local_3c8._8_8_ != local_3c8._0_8_) {
      uVar13 = 0;
      do {
        sprintf(local_78,"${ARGV%u}",uVar13);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char(&)[60]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268,
                   (char (*) [60])local_78);
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (uVar13 < (ulong)((long)(local_3c8._8_8_ - local_3c8._0_8_) >> 5));
    }
    local_2e8._M_p = (pointer)&local_2d8;
    local_308._0_8_ = local_308 + 0x10;
    local_308._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_308._16_8_ = local_308._16_8_ & 0xffffffffffffff00;
    local_2e0 = 0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8 = (undefined1  [16])0x0;
    local_2b8 = (undefined1  [16])0x0;
    local_2a8 = (undefined1  [16])0x0;
    local_298 = (pointer)0x0;
    pcVar16 = (pcVar3->Functions).
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_280 = (pcVar3->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_finish;
    bVar7 = 1;
    if (pcVar16 != local_280) {
      paVar1 = &local_3a8.field_2;
      local_290 = (cmExecutionStatus *)&local_380->BreakInvoked;
      local_288 = (cmExecutionStatus *)&local_380->NestedError;
      do {
        uVar4 = local_2a8._0_8_;
        uVar5 = local_2a8._8_8_;
        local_378 = pcVar16;
        if (local_2a8._8_8_ != local_2a8._0_8_) {
          paVar14 = &((string *)local_2a8._0_8_)->field_2;
          do {
            plVar9 = (long *)(((string *)(paVar14 + -1))->_M_dataplus)._M_p;
            if (paVar14 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar9) {
              operator_delete(plVar9,paVar14->_M_allocated_capacity + 1);
            }
            pcVar15 = (pointer)((long)paVar14 + 0x38);
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar14 + 0x48);
          } while (pcVar15 != (pointer)uVar5);
          local_2a8._8_8_ = uVar4;
        }
        pcVar16 = local_378;
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::reserve
                  ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_2a8,
                   ((long)(local_378->Arguments).
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_378->Arguments).
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
        std::__cxx11::string::_M_assign((string *)local_308);
        std::__cxx11::string::_M_assign((string *)(local_308 + 0x20));
        local_2c8._0_8_ = (pcVar16->super_cmCommandContext).Line;
        pcVar2 = (pcVar16->Arguments).
                 super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        for (pcVar15 = (pcVar16->Arguments).
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                       _M_impl.super__Vector_impl_data._M_start; pcVar15 != pcVar2;
            pcVar15 = pcVar15 + 1) {
          local_370.Value._M_dataplus._M_p = (pointer)&local_370.Value.field_2;
          local_370.Value._M_string_length = 0;
          local_370.Value.field_2._M_local_buf[0] = '\0';
          local_370.Delim = Unquoted;
          local_370.Line = 0;
          local_370.Col._0_4_ = 0xffffffff;
          local_370.Col._4_4_ = 0xffffffff;
          local_370.LineEnd._0_4_ = 0xffffffff;
          local_370.LineEnd._4_4_ = 0xffffffff;
          local_370.ColEnd = -1;
          std::__cxx11::string::_M_assign((string *)&local_370);
          if (pcVar15->Delim != Bracket) {
            if (local_328.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_328.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar13 = 0;
              uVar17 = 1;
              do {
                cmsys::SystemTools::ReplaceString
                          (&local_370.Value,
                           local_328.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar13,
                           (string *)(local_3c8._0_8_ + uVar13 * 0x20));
                bVar6 = uVar17 < (ulong)((long)local_328.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_328.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 5);
                uVar13 = uVar17;
                uVar17 = (ulong)((int)uVar17 + 1);
              } while (bVar6);
            }
            local_3a8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"${ARGC}","");
            cmsys::SystemTools::ReplaceString(&local_370.Value,&local_3a8,&local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != paVar1) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
            }
            local_3a8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"${ARGN}","");
            cmsys::SystemTools::ReplaceString(&local_370.Value,&local_3a8,&local_230);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != paVar1) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
            }
            local_3a8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"${ARGV}","");
            cmsys::SystemTools::ReplaceString(&local_370.Value,&local_3a8,&local_250);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != paVar1) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
            }
            lVar10 = std::__cxx11::string::find((char *)&local_370,0x4f5fdb,0);
            if (lVar10 != -1) {
              if (local_3c8._8_8_ != local_3c8._0_8_) {
                uVar13 = 0;
                uVar17 = 1;
                do {
                  cmsys::SystemTools::ReplaceString
                            (&local_370.Value,
                             local_268.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar13,
                             (string *)(local_3c8._0_8_ + uVar13 * 0x20));
                  bVar6 = uVar17 < (ulong)((long)(local_3c8._8_8_ - local_3c8._0_8_) >> 5);
                  uVar13 = uVar17;
                  uVar17 = (ulong)((int)uVar17 + 1);
                } while (bVar6);
              }
            }
          }
          local_370.Delim = pcVar15->Delim;
          local_370.Line = pcVar15->Line;
          std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
          emplace_back<cmListFileArgument>
                    ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_2a8,
                     &local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.Value._M_dataplus._M_p != &local_370.Value.field_2) {
            operator_delete(local_370.Value._M_dataplus._M_p,
                            CONCAT71(local_370.Value.field_2._M_allocated_capacity._1_7_,
                                     local_370.Value.field_2._M_local_buf[0]) + 1);
          }
        }
        local_370.Value._M_dataplus._M_p = local_370.Value._M_dataplus._M_p & 0xffffffff00000000;
        bVar6 = cmMakefile::ExecuteCommand
                          ((local_388->super_cmCommand).Makefile,(cmListFileFunction *)local_308,
                           (cmExecutionStatus *)&local_370);
        if ((bVar6) && (local_370.Value._M_dataplus._M_p._3_1_ != '\x01')) {
          bVar7 = 1;
          pcVar12 = local_380;
          if ((char)local_370.Value._M_dataplus._M_p != '\0') goto LAB_001d55a0;
          bVar7 = 1;
          bVar6 = true;
          pcVar12 = local_290;
          if (local_370.Value._M_dataplus._M_p._1_1_ == '\x01') goto LAB_001d55a0;
        }
        else {
          local_278.ReportError = false;
          bVar7 = 0;
          pcVar12 = local_288;
LAB_001d55a0:
          pcVar12->ReturnInvoked = true;
          bVar6 = false;
          local_3c9 = bVar7;
        }
        bVar7 = local_3c9;
        if (!bVar6) goto LAB_001d5607;
        pcVar16 = local_378 + 1;
      } while (pcVar16 != local_280);
      bVar7 = 1;
    }
LAB_001d5607:
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_p != &local_2d8) {
      operator_delete(local_2e8._M_p,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_308 + 0x10)) {
      operator_delete((void *)local_308._0_8_,(ulong)(local_308._16_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_268);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
    std::ios_base::~ios_base(local_180);
    cmMakefile::MacroPushPop::~MacroPushPop(&local_278);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3c8);
  return (bool)(bVar7 & 1);
}

Assistant:

bool cmMacroHelperCommand::InvokeInitialPass(
  const std::vector<cmListFileArgument>& args, cmExecutionStatus& inStatus)
{
  // Expand the argument list to the macro.
  std::vector<std::string> expandedArgs;
  this->Makefile->ExpandArguments(args, expandedArgs);

  // make sure the number of arguments passed is at least the number
  // required by the signature
  if (expandedArgs.size() < this->Args.size() - 1) {
    std::string errorMsg =
      "Macro invoked with incorrect arguments for macro named: ";
    errorMsg += this->Args[0];
    this->SetError(errorMsg);
    return false;
  }

  cmMakefile::MacroPushPop macroScope(this->Makefile, this->FilePath,
                                      this->Policies);

  // set the value of argc
  std::ostringstream argcDefStream;
  argcDefStream << expandedArgs.size();
  std::string argcDef = argcDefStream.str();

  std::vector<std::string>::const_iterator eit =
    expandedArgs.begin() + (this->Args.size() - 1);
  std::string expandedArgn = cmJoin(cmMakeRange(eit, expandedArgs.end()), ";");
  std::string expandedArgv = cmJoin(expandedArgs, ";");
  std::vector<std::string> variables;
  variables.reserve(this->Args.size() - 1);
  for (unsigned int j = 1; j < this->Args.size(); ++j) {
    variables.push_back("${" + this->Args[j] + "}");
  }
  std::vector<std::string> argVs;
  argVs.reserve(expandedArgs.size());
  char argvName[60];
  for (unsigned int j = 0; j < expandedArgs.size(); ++j) {
    sprintf(argvName, "${ARGV%u}", j);
    argVs.emplace_back(argvName);
  }
  // Invoke all the functions that were collected in the block.
  cmListFileFunction newLFF;
  // for each function
  for (cmListFileFunction const& func : this->Functions) {
    // Replace the formal arguments and then invoke the command.
    newLFF.Arguments.clear();
    newLFF.Arguments.reserve(func.Arguments.size());
    newLFF.Name = func.Name;
    newLFF.Line = func.Line;

    // for each argument of the current function
    for (cmListFileArgument const& k : func.Arguments) {
      cmListFileArgument arg;
      arg.Value = k.Value;
      if (k.Delim != cmListFileArgument::Bracket) {
        // replace formal arguments
        for (unsigned int j = 0; j < variables.size(); ++j) {
          cmSystemTools::ReplaceString(arg.Value, variables[j],
                                       expandedArgs[j]);
        }
        // replace argc
        cmSystemTools::ReplaceString(arg.Value, "${ARGC}", argcDef);

        cmSystemTools::ReplaceString(arg.Value, "${ARGN}", expandedArgn);
        cmSystemTools::ReplaceString(arg.Value, "${ARGV}", expandedArgv);

        // if the current argument of the current function has ${ARGV in it
        // then try replacing ARGV values
        if (arg.Value.find("${ARGV") != std::string::npos) {
          for (unsigned int t = 0; t < expandedArgs.size(); ++t) {
            cmSystemTools::ReplaceString(arg.Value, argVs[t], expandedArgs[t]);
          }
        }
      }
      arg.Delim = k.Delim;
      arg.Line = k.Line;
      newLFF.Arguments.push_back(std::move(arg));
    }
    cmExecutionStatus status;
    if (!this->Makefile->ExecuteCommand(newLFF, status) ||
        status.GetNestedError()) {
      // The error message should have already included the call stack
      // so we do not need to report an error here.
      macroScope.Quiet();
      inStatus.SetNestedError();
      return false;
    }
    if (status.GetReturnInvoked()) {
      inStatus.SetReturnInvoked();
      return true;
    }
    if (status.GetBreakInvoked()) {
      inStatus.SetBreakInvoked();
      return true;
    }
  }
  return true;
}